

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O3

void __thiscall Timidity::Renderer::adjust_volume(Renderer *this,int chan)

{
  Voice *v;
  long lVar1;
  long lVar2;
  
  lVar2 = (long)this->voices;
  if (lVar2 != 0) {
    lVar1 = lVar2 * 0x170;
    do {
      if (((uint)(&this->voice[-1].channel)[lVar1] == chan) &&
         (v = (Voice *)(&this->voice[-1].status + lVar1), (v->status & 1) != 0)) {
        recompute_amp(this,v);
        apply_envelope_to_amp((Voice *)(&this->voice[-1].status + lVar1));
      }
      lVar2 = lVar2 + -1;
      lVar1 = lVar1 + -0x170;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void Renderer::adjust_volume(int chan)
{
	int i = voices;
	while (i--)
	{
		if (voice[i].channel == chan && (voice[i].status & VOICE_RUNNING))
		{
			recompute_amp(&voice[i]);
			apply_envelope_to_amp(&voice[i]);
		}
	}
}